

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractslider.cpp
# Opt level: O2

void __thiscall QAbstractSlider::keyPressEvent(QAbstractSlider *this,QKeyEvent *ev)

{
  byte bVar1;
  long lVar2;
  bool bVar3;
  SliderAction action;
  int iStack_20;
  
  if (7 < *(int *)(ev + 0x40) + 0xfefffff0U) {
    ev[0xc] = (QKeyEvent)0x0;
    return;
  }
  lVar2 = *(long *)&(this->super_QWidget).field_0x8;
  action = SliderToMinimum;
  switch(*(int *)(ev + 0x40)) {
  case 0x1000011:
    action = SliderToMaximum;
    break;
  case 0x1000012:
    bVar3 = QWidget::isRightToLeft(&this->super_QWidget);
    bVar1 = *(byte *)(lVar2 + 0x27c);
    if (!bVar3) goto LAB_003a002d;
    goto LAB_003a000a;
  case 0x1000013:
    bVar1 = *(byte *)(lVar2 + 0x27c);
    goto LAB_003a000a;
  case 0x1000014:
    bVar3 = QWidget::isRightToLeft(&this->super_QWidget);
    bVar1 = *(byte *)(lVar2 + 0x27c);
    if (bVar3) goto LAB_003a002d;
LAB_003a000a:
    iStack_20 = 2;
LAB_003a003f:
    action = iStack_20 - (uint)((bVar1 & 0x10) == 0);
    break;
  case 0x1000015:
    bVar1 = *(byte *)(lVar2 + 0x27c);
LAB_003a002d:
    action = ((bVar1 & 0x10) == 0) + SliderSingleStepAdd;
    break;
  case 0x1000016:
    bVar1 = *(byte *)(lVar2 + 0x27c);
    iStack_20 = 4;
    goto LAB_003a003f;
  case 0x1000017:
    action = ((*(byte *)(lVar2 + 0x27c) & 0x10) == 0) + SliderPageStepAdd;
  }
  triggerAction(this,action);
  return;
}

Assistant:

void QAbstractSlider::keyPressEvent(QKeyEvent *ev)
{
    Q_D(QAbstractSlider);
    SliderAction action = SliderNoAction;
#ifdef QT_KEYPAD_NAVIGATION
    if (ev->isAutoRepeat()) {
        if (!d->firstRepeat.isValid())
            d->firstRepeat.start();
        else if (1 == d->repeatMultiplier) {
            // This is the interval in milli seconds which one key repetition
            // takes.
            const int repeatMSecs = d->firstRepeat.elapsed();

            /**
             * The time it takes to currently navigate the whole slider.
             */
            const qreal currentTimeElapse = (qreal(maximum()) / singleStep()) * repeatMSecs;

            /**
             * This is an arbitrarily determined constant in msecs that
             * specifies how long time it should take to navigate from the
             * start to the end(excluding starting key auto repeat).
             */
            const int SliderRepeatElapse = 2500;

            d->repeatMultiplier = currentTimeElapse / SliderRepeatElapse;
        }

    }
    else if (d->firstRepeat.isValid()) {
        d->firstRepeat.invalidate();
        d->repeatMultiplier = 1;
    }

#endif

    switch (ev->key()) {
#ifdef QT_KEYPAD_NAVIGATION
        case Qt::Key_Select:
            if (QApplicationPrivate::keypadNavigationEnabled())
                setEditFocus(!hasEditFocus());
            else
                ev->ignore();
            break;
        case Qt::Key_Back:
            if (QApplicationPrivate::keypadNavigationEnabled() && hasEditFocus()) {
                setValue(d->origValue);
                setEditFocus(false);
            } else
                ev->ignore();
            break;
#endif

        case Qt::Key_Left:
#ifdef QT_KEYPAD_NAVIGATION
            // In QApplication::KeypadNavigationDirectional, we want to change the slider
            // value if there is no left/right navigation possible and if this slider is not
            // inside a tab widget.
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (!hasEditFocus() && QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Vertical
                    || !hasEditFocus()
                    && (QWidgetPrivate::canKeypadNavigate(Qt::Horizontal) || QWidgetPrivate::inTabWidget(this)))) {
                ev->ignore();
                return;
            }
            if (QApplicationPrivate::keypadNavigationEnabled() && d->orientation == Qt::Vertical)
                action = d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            else
#endif
            if (isRightToLeft())
                action = d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            else
                action = !d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            break;
        case Qt::Key_Right:
#ifdef QT_KEYPAD_NAVIGATION
            // Same logic as in Qt::Key_Left
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (!hasEditFocus() && QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Vertical
                    || !hasEditFocus()
                    && (QWidgetPrivate::canKeypadNavigate(Qt::Horizontal) || QWidgetPrivate::inTabWidget(this)))) {
                ev->ignore();
                return;
            }
            if (QApplicationPrivate::keypadNavigationEnabled() && d->orientation == Qt::Vertical)
                action = d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            else
#endif
            if (isRightToLeft())
                action = d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            else
                action = !d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            break;
        case Qt::Key_Up:
#ifdef QT_KEYPAD_NAVIGATION
            // In QApplication::KeypadNavigationDirectional, we want to change the slider
            // value if there is no up/down navigation possible.
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Horizontal
                    || !hasEditFocus() && QWidgetPrivate::canKeypadNavigate(Qt::Vertical))) {
                ev->ignore();
                break;
            }
#endif
            action = d->invertedControls ? SliderSingleStepSub : SliderSingleStepAdd;
            break;
        case Qt::Key_Down:
#ifdef QT_KEYPAD_NAVIGATION
            // Same logic as in Qt::Key_Up
            if (QApplicationPrivate::keypadNavigationEnabled()
                    && (QApplication::navigationMode() == Qt::NavigationModeKeypadTabOrder
                    || d->orientation == Qt::Horizontal
                    || !hasEditFocus() && QWidgetPrivate::canKeypadNavigate(Qt::Vertical))) {
                ev->ignore();
                break;
            }
#endif
            action = d->invertedControls ? SliderSingleStepAdd : SliderSingleStepSub;
            break;
        case Qt::Key_PageUp:
            action = d->invertedControls ? SliderPageStepSub : SliderPageStepAdd;
            break;
        case Qt::Key_PageDown:
            action = d->invertedControls ? SliderPageStepAdd : SliderPageStepSub;
            break;
        case Qt::Key_Home:
            action = SliderToMinimum;
            break;
        case Qt::Key_End:
            action = SliderToMaximum;
            break;
        default:
            ev->ignore();
            break;
    }
    if (action)
        triggerAction(action);
}